

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O2

void __thiscall
de::AppendList<vk::AllocationCallbackRecord>::append
          (AppendList<vk::AllocationCallbackRecord> *this,AllocationCallbackRecord *value)

{
  size_t *psVar1;
  void **ppvVar2;
  AllocationCallbackRecord *pAVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  Type TVar8;
  undefined4 uVar9;
  ulong uVar10;
  Block *this_00;
  ulong uVar11;
  Block *pBVar12;
  
  pBVar12 = this->m_last;
  LOCK();
  psVar1 = &this->m_numElements;
  uVar11 = *psVar1;
  *psVar1 = *psVar1 + 1;
  UNLOCK();
  uVar10 = uVar11 / this->m_blockSize;
  uVar11 = uVar11 % this->m_blockSize;
  while (pBVar12->blockNdx != uVar10) {
    if (pBVar12->next == (Block *)0x0) {
      deYield();
    }
    else {
      pBVar12 = pBVar12->next;
    }
  }
  if (uVar11 + 1 == this->m_blockSize) {
    this_00 = (Block *)operator_new(0x18);
    Block::Block(this_00,uVar10 + 1,uVar11 + 1);
    this->m_last = this_00;
    pBVar12->next = this_00;
  }
  pAVar3 = pBVar12->elements;
  TVar8 = value->type;
  uVar9 = *(undefined4 *)&value->field_0x4;
  sVar4 = (value->data).allocation.size;
  sVar5 = (value->data).allocation.alignment;
  sVar6 = (value->data).reallocation.alignment;
  pvVar7 = (value->data).reallocation.returnedPtr;
  ppvVar2 = &pAVar3[uVar11].data.allocation.returnedPtr;
  *ppvVar2 = (value->data).allocation.returnedPtr;
  ppvVar2[1] = pvVar7;
  psVar1 = &pAVar3[uVar11].data.allocation.alignment;
  *psVar1 = sVar5;
  psVar1[1] = sVar6;
  pAVar3 = pAVar3 + uVar11;
  pAVar3->type = TVar8;
  *(undefined4 *)&pAVar3->field_0x4 = uVar9;
  (pAVar3->data).allocation.size = sVar4;
  return;
}

Assistant:

void AppendList<ElementType>::append (const ElementType& value)
{
	// Fetch curBlock first before allocating slot. Otherwise m_last might get updated before
	// this thread gets chance of reading it, leading to curBlock->blockNdx > blockNdx.
	Block*			curBlock	= m_last;

	deMemoryReadWriteFence();

	{
		const size_t	elementNdx	= deAtomicIncrementUSize(&m_numElements) - 1;
		const size_t	blockNdx	= elementNdx / m_blockSize;
		const size_t	slotNdx		= elementNdx - (blockNdx * m_blockSize);

		while (curBlock->blockNdx != blockNdx)
		{
			if (curBlock->next)
				curBlock = curBlock->next;
			else
			{
				// Other thread(s) are currently allocating additional block(s)
				deYield();
			}
		}

		// Did we allocate last slot? If so, add a new block
		if (slotNdx+1 == m_blockSize)
		{
			Block* const	newBlock	= new Block(blockNdx+1, m_blockSize);

			deMemoryReadWriteFence();

			// At this point if any other thread is trying to allocate more blocks
			// they are being blocked by curBlock->next being null. This guarantees
			// that this thread has exclusive modify access to m_last.
			m_last = newBlock;
			deMemoryReadWriteFence();

			// At this point other threads might have skipped to newBlock, but we
			// still have exclusive modify access to curBlock->next.
			curBlock->next = newBlock;
			deMemoryReadWriteFence();
		}

		new (&curBlock->elements[slotNdx]) ElementType(value);
	}
}